

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void writeTiledRgbaMIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  int xMax;
  int yMax;
  int level;
  int lx;
  float in_XMM2_Da;
  Array2D<Imf_2_5::Rgba> pixels;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  local_38 = 0;
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            (&out,fileName,width,height,tileWidth,tileHeight,MIPMAP_LEVELS,ROUND_DOWN,WRITE_RGBA,1.0
             ,(V2f)0x3f800000,in_XMM2_Da,(LineOrder)&local_38,NO_COMPRESSION,3);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(&pixels,(long)height,(long)width);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer(&out,pixels._data,1,(long)width);
  lx = 0;
  while( true ) {
    iVar1 = Imf_2_5::TiledRgbaOutputFile::numLevels(&out);
    if (iVar1 <= lx) break;
    iVar1 = Imf_2_5::TiledRgbaOutputFile::levelWidth(&out,lx);
    iVar2 = Imf_2_5::TiledRgbaOutputFile::levelHeight(&out,lx);
    xMax = Imf_2_5::TiledRgbaOutputFile::levelWidth(&out,lx);
    yMax = Imf_2_5::TiledRgbaOutputFile::levelHeight(&out,lx);
    drawImage4(&pixels,iVar1,iVar2,0,xMax,0,yMax,lx,lx);
    iVar1 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,lx);
    iVar2 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,lx);
    Imf_2_5::TiledRgbaOutputFile::writeTiles(&out,0,iVar1 + -1,0,iVar2 + -1,lx);
    lx = lx + 1;
  }
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&pixels);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaMIP1 (const char fileName[],
                    int width, int height,
                    int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (fileName,
                             width, height,		// image size
                             tileWidth, tileHeight,	// tile size
                             MIPMAP_LEVELS,		// level mode
			     ROUND_DOWN,		// rounding mode
                             WRITE_RGBA);		// channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        drawImage4 (pixels,
		    out.levelWidth (level), out.levelHeight (level),
                    0, out.levelWidth (level),
		    0, out.levelHeight (level),
                    level, level);

	out.writeTiles (0, out.numXTiles (level) - 1,
			0, out.numYTiles (level) - 1,
			level);
    }
}